

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnSelectExpr
          (BinaryReaderIR *this,Index result_count,Type *result_types)

{
  Result RVar1;
  Expr *pEVar2;
  TypeVector results;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_58;
  _Head_base<0UL,_wabt::Expr_*,_false> local_40;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_38;
  
  local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_assign_aux<wabt::Type*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_58,result_types,
             result_types + result_count);
  pEVar2 = (Expr *)operator_new(0x58);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_38,&local_58);
  *(undefined8 *)((long)&(pEVar2->loc).filename._M_str + 4) = 0;
  *(undefined8 *)((long)&(pEVar2->loc).field_1.field_1.offset + 4) = 0;
  (pEVar2->loc).filename._M_len = 0;
  (pEVar2->loc).filename._M_str = (char *)0x0;
  (pEVar2->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  (pEVar2->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  pEVar2->type_ = Select;
  pEVar2->_vptr_Expr = (_func_int **)&PTR__SelectExpr_001a04d0;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(pEVar2 + 1),&local_38);
  if (local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_40._M_head_impl = pEVar2;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_40);
  if (local_40._M_head_impl != (Expr *)0x0) {
    (*(local_40._M_head_impl)->_vptr_Expr[1])();
  }
  if (local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnSelectExpr(Index result_count, Type* result_types) {
  TypeVector results;
  results.assign(result_types, result_types + result_count);
  return AppendExpr(std::make_unique<SelectExpr>(results));
}